

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

void __thiscall TPZVec<char>::TPZVec(TPZVec<char> *this,TPZVec<char> *copy)

{
  char *pcVar1;
  long lVar2;
  long lVar3;
  
  this->_vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b730;
  this->fStore = (char *)0x0;
  if (copy->fNElements < 1) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = (char *)operator_new__(copy->fNElements);
  }
  this->fStore = pcVar1;
  lVar3 = copy->fNElements;
  if (0 < lVar3) {
    lVar2 = 0;
    do {
      this->fStore[lVar2] = copy->fStore[lVar2];
      lVar2 = lVar2 + 1;
      lVar3 = copy->fNElements;
    } while (lVar2 < lVar3);
  }
  this->fNElements = lVar3;
  this->fNAlloc = copy->fNAlloc;
  return;
}

Assistant:

TPZVec<T>::TPZVec(const TPZVec<T> &copy){
	fStore = nullptr;
	
	if( copy.fNElements > 0 )
		fStore = new T[copy.fNElements];
	else
		fStore = nullptr;
	
	for(int64_t i=0; i<copy.fNElements; i++)
		fStore[i]=copy.fStore[i];
	
	fNElements = copy.fNElements;
    fNAlloc = copy.fNAlloc;
}